

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateReplayer::Impl::parse_depth_clamp_control
          (Impl *this,Value *state,VkPipelineViewportDepthClampControlCreateInfoEXT **out_info)

{
  double dVar1;
  VkPipelineViewportDepthClampControlCreateInfoEXT *pVVar2;
  Type pGVar3;
  Number NVar4;
  VkDepthClampRangeEXT *pVVar5;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_00;
  undefined8 local_30;
  
  pVVar2 = (VkPipelineViewportDepthClampControlCreateInfoEXT *)
           ScratchAllocator::allocate_raw(&this->allocator,0x20,0x10);
  if (pVVar2 != (VkPipelineViewportDepthClampControlCreateInfoEXT *)0x0) {
    *(undefined8 *)&pVVar2->depthClampMode = 0;
    pVVar2->pDepthClampRange = (VkDepthClampRangeEXT *)0x0;
    *(undefined8 *)pVVar2 = 0;
    pVVar2->pNext = (void *)0x0;
  }
  pGVar3 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"depthClampMode");
  if ((undefined1  [16])((undefined1  [16])pGVar3->data_ & (undefined1  [16])0x40000000000000) !=
      (undefined1  [16])0x0) {
    pVVar2->depthClampMode = (pGVar3->data_).s.length;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&stack0xffffffffffffffd0,(Ch *)state);
    NVar4.i = (I)rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::MemberEnd(state);
    if (local_30 != NVar4.i64) {
      pVVar5 = (VkDepthClampRangeEXT *)ScratchAllocator::allocate_raw(&this->allocator,8,0x10);
      if (pVVar5 != (VkDepthClampRangeEXT *)0x0) {
        pVVar5->minDepthClamp = 0.0;
        pVVar5->maxDepthClamp = 0.0;
      }
      pVVar2->pDepthClampRange = pVVar5;
      this_00 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 *)rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)state,"depthClampRange");
      pGVar3 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"minDepthClamp");
      dVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetDouble(pGVar3);
      pVVar5->minDepthClamp = (float)dVar1;
      pGVar3 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"maxDepthClamp");
      dVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetDouble(pGVar3);
      pVVar5->maxDepthClamp = (float)dVar1;
    }
    *out_info = pVVar2;
    return true;
  }
  __assert_fail("data_.f.flags & kUintFlag",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                ,0x719,
                "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

bool StateReplayer::Impl::parse_depth_clamp_control(const Value &state, VkPipelineViewportDepthClampControlCreateInfoEXT **out_info)
{
	auto *info = allocator.allocate_cleared<VkPipelineViewportDepthClampControlCreateInfoEXT>();
	info->depthClampMode = static_cast<VkDepthClampModeEXT>(state["depthClampMode"].GetUint());
	if (state.HasMember("depthClampRange"))
	{
		auto *range = allocator.allocate_cleared<VkDepthClampRangeEXT>();
		info->pDepthClampRange = range;
		auto &v = state["depthClampRange"];
		range->minDepthClamp = v["minDepthClamp"].GetFloat();
		range->maxDepthClamp = v["maxDepthClamp"].GetFloat();
	}
	*out_info = info;
	return true;
}